

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O3

secp256k1_context * secp256k1_context_clone(secp256k1_context *ctx)

{
  void *prealloc;
  secp256k1_context *psVar1;
  
  prealloc = malloc((ulong)((ctx->ecmult_ctx).pre_g != (secp256k1_ge_storage_0_ *)0x0) << 0x14 |
                    0xe0);
  if (prealloc == (void *)0x0) {
    (*(ctx->error_callback).fn)("Out of memory",(ctx->error_callback).data);
  }
  psVar1 = secp256k1_context_preallocated_clone(ctx,prealloc);
  return psVar1;
}

Assistant:

secp256k1_context* secp256k1_context_clone(const secp256k1_context* ctx) {
    secp256k1_context* ret;
    size_t prealloc_size;

    VERIFY_CHECK(ctx != NULL);
    prealloc_size = secp256k1_context_preallocated_clone_size(ctx);
    ret = (secp256k1_context*)checked_malloc(&ctx->error_callback, prealloc_size);
    ret = secp256k1_context_preallocated_clone(ctx, ret);
    return ret;
}